

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void ggml_backend_tensor_get_async
               (ggml_backend_t backend,ggml_tensor *tensor,void *data,size_t offset,size_t size)

{
  ulong uVar1;
  size_t sVar2;
  size_t in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  long in_RDI;
  size_t in_R8;
  
  if (in_RSI->data == (void *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
               ,0xf6,"GGML_ASSERT(%s) failed","tensor->data != NULL && \"tensor not allocated\"");
  }
  uVar1 = in_RCX + in_R8;
  sVar2 = ggml_nbytes(in_RDX);
  if (sVar2 < uVar1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
               ,0xf7,"GGML_ASSERT(%s) failed",
               "offset + size <= ggml_nbytes(tensor) && \"tensor read out of bounds\"");
  }
  if (*(long *)(in_RDI + 0x20) == 0) {
    ggml_backend_tensor_get(in_RSI,in_RDX,in_RCX,in_R8);
  }
  else {
    (**(code **)(in_RDI + 0x20))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return;
}

Assistant:

void ggml_backend_tensor_get_async(ggml_backend_t backend, const struct ggml_tensor * tensor, void * data, size_t offset, size_t size) {
    GGML_ASSERT(tensor->data != NULL && "tensor not allocated");
    GGML_ASSERT(offset + size <= ggml_nbytes(tensor) && "tensor read out of bounds");

    if (backend->iface.get_tensor_async == NULL) {
        ggml_backend_tensor_get(tensor, data, offset, size);
    } else {
        backend->iface.get_tensor_async(backend, tensor, data, offset, size);
    }
}